

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

bool __thiscall ON_Texture::SwapTextureCoordinate(ON_Texture *this,int i,int j)

{
  ON_Xform local_120;
  undefined1 local_a0 [8];
  ON_Xform x;
  bool rc;
  int j_local;
  int i_local;
  ON_Texture *this_local;
  
  x.m_xform[3][3]._7_1_ = false;
  if ((((i != j) && (-1 < i)) && (i < 4)) && ((-1 < j && (j < 4)))) {
    memcpy(local_a0,&ON_Xform::IdentityTransformation,0x80);
    x.m_xform[(long)j + -1][(long)j + 3] = 0.0;
    x.m_xform[(long)i + -1][(long)i + 3] = 0.0;
    x.m_xform[(long)j + -1][(long)i + 3] = 1.0;
    x.m_xform[(long)i + -1][(long)j + 3] = 1.0;
    ON_Xform::operator*(&local_120,(ON_Xform *)local_a0,&this->m_uvw);
    memcpy(&this->m_uvw,&local_120,0x80);
    x.m_xform[3][3]._7_1_ = true;
  }
  return (bool)x.m_xform[3][3]._7_1_;
}

Assistant:

bool ON_Texture::SwapTextureCoordinate( int i, int j )
{
  bool rc = false;
  if (i!=j && 0 <= i && i <= 3 && 0 <= j && j <= 3)
  {
    ON_Xform x(ON_Xform::IdentityTransformation);
    x.m_xform[i][i] = x.m_xform[j][j] = 0.0;
    x.m_xform[i][j] = x.m_xform[j][i] = 1.0;
    m_uvw = x*m_uvw;
    rc = true;
  }
  return rc;
}